

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TransformFeedbackVaryingTestGroup::init
          (TransformFeedbackVaryingTestGroup *this,EVP_PKEY_CTX *ctx)

{
  ContextType type;
  GLSLVersion glslVersion_00;
  int extraout_EAX;
  RenderContext *pRVar1;
  TestCaseGroup *pTVar2;
  TestCaseGroup *blockGroup_3;
  TestCaseGroup *blockGroup_2;
  TestCaseGroup *blockGroup_1;
  TestCaseGroup *blockGroup;
  GLSLVersion glslVersion;
  TransformFeedbackVaryingTestGroup *this_local;
  
  pRVar1 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  glslVersion_00 = glu::getContextTypeGLSLVersion(type);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"resource_list","Resource list");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateTransformFeedbackShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateTransformFeedbackResourceListBlockContents);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"array_size","Array size");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateTransformFeedbackShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateTransformFeedbackVariableBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)2>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"name_length","Name length");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateTransformFeedbackShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateTransformFeedbackVariableBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)256>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,(this->super_TestCaseGroup).m_context,"type","Type");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateTransformFeedbackShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion_00,
             generateTransformFeedbackVariableTypeBlockContents);
  return extraout_EAX;
}

Assistant:

void TransformFeedbackVaryingTestGroup::init (void)
{
	const glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	// .resource_list
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "resource_list", "Resource list");
		addChild(blockGroup);
		generateTransformFeedbackShaderCaseBlocks(m_context, blockGroup, glslVersion, generateTransformFeedbackResourceListBlockContents);
	}

	// .array_size
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "array_size", "Array size");
		addChild(blockGroup);
		generateTransformFeedbackShaderCaseBlocks(m_context, blockGroup, glslVersion, generateTransformFeedbackVariableBlockContents<PROGRAMRESOURCEPROP_ARRAY_SIZE>);
	}

	// .name_length
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "name_length", "Name length");
		addChild(blockGroup);
		generateTransformFeedbackShaderCaseBlocks(m_context, blockGroup, glslVersion, generateTransformFeedbackVariableBlockContents<PROGRAMRESOURCEPROP_NAME_LENGTH>);
	}

	// .type
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "type", "Type");
		addChild(blockGroup);
		generateTransformFeedbackShaderCaseBlocks(m_context, blockGroup, glslVersion, generateTransformFeedbackVariableTypeBlockContents);
	}
}